

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<QPixmapStyle::ControlPixmap,QPixmapStylePixmap>::
tryEmplace_impl<QPixmapStyle::ControlPixmap_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,ControlPixmap *key)

{
  uchar uVar1;
  uint *puVar2;
  Span *pSVar3;
  Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *pDVar4;
  ulong uVar5;
  Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *pNVar7;
  long in_FS_OFFSET;
  bool bVar9;
  Bucket BVar10;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> local_40;
  long local_38;
  Span *pSVar6;
  ulong uVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*this == 0) {
    pDVar4 = QHashPrivate::
             Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::detached
                       ((Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>
                         *)0x0);
    *(Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> **)this = pDVar4;
  }
  local_40.d = (Data *)0x0;
  uVar5 = (*this)->seed;
  uVar5 = (uVar5 >> 0x20 ^ *key ^ uVar5) * -0x2917014799a6026d;
  uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
  uVar5 = uVar5 >> 0x20 ^ uVar5;
  BVar10 = QHashPrivate::Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>
           ::findBucketWithHash<QPixmapStyle::ControlPixmap>(*this,key,uVar5);
  uVar8 = BVar10.index;
  pSVar6 = BVar10.span;
  uVar1 = pSVar6->offsets[uVar8];
  puVar2 = *this;
  if ((puVar2 == (uint *)0x0) || (1 < *puVar2)) {
LAB_0034878a:
    QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::operator=
              (&local_40,(QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)this);
    if (uVar1 == 0xff) {
      bVar9 = *(ulong *)(*this + 0x10) >> 1 <= *(ulong *)(*this + 8);
    }
    else {
      bVar9 = false;
    }
    pDVar4 = *this;
    pSVar3 = pDVar4->spans;
    if (bVar9) {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::detached
                         (pDVar4,pDVar4->size + 1);
    }
    else {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::detached
                         (pDVar4);
    }
    *(Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> **)this = pDVar4;
    if (bVar9) {
      BVar10 = QHashPrivate::
               Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
               findBucketWithHash<QPixmapStyle::ControlPixmap>(pDVar4,key,uVar5);
    }
    else {
      BVar10.index._0_4_ = (uint)BVar10.index & 0x7f;
      BVar10.span = pDVar4->spans +
                    ((((ulong)((long)pSVar6 - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | uVar8) >> 7
                    );
      BVar10.index._4_4_ = 0;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00348886;
    if (*(ulong *)(puVar2 + 4) >> 1 <= *(ulong *)(puVar2 + 2)) goto LAB_0034878a;
  }
  if (uVar1 == 0xff) {
    pNVar7 = QHashPrivate::
             Span<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::insert
                       (BVar10.span,BVar10.index);
    pNVar7->key = *key;
    *(undefined8 *)&(pNVar7->value).field_0x10 = 0;
    (pNVar7->value).margins.m_left = 0;
    (pNVar7->value).margins.m_top = 0;
    *(undefined8 *)&pNVar7->value = 0;
    *(undefined8 *)&(pNVar7->value).field_0x8 = 0;
    (pNVar7->value).margins.m_right = 0;
    (pNVar7->value).margins.m_bottom = 0;
    QPixmap::QPixmap(&(pNVar7->value).pixmap);
    (pNVar7->value).margins.m_left = 0;
    (pNVar7->value).margins.m_top = 0;
    (pNVar7->value).margins.m_right = 0;
    (pNVar7->value).margins.m_bottom = 0;
    *(long *)(*this + 8) = *(long *)(*this + 8) + 1;
  }
LAB_00348886:
  pSVar6 = (*this)->spans;
  (__return_storage_ptr__->iterator).i.d = *this;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar10.span - (long)pSVar6) >> 4) * 0x1c71c71c71c71c80 | BVar10.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }